

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O3

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::loop
          (TestMoreStuffImpl *this,uint depth,Client *cap,ExpectCancelContext context)

{
  pointer_____offset_0x10___ puVar1;
  _func_int **pp_Var2;
  PromiseNode *pPVar3;
  long *plVar4;
  TransformPromiseNodeBase *this_00;
  ImmediatePromiseNode<kj::_::Void> *pIVar5;
  ImmediatePromiseNode<kj::_::Void> *extraout_RDX;
  ImmediatePromiseNode<kj::_::Void> *extraout_RDX_00;
  ImmediatePromiseNode<kj::_::Void> *extraout_RDX_01;
  undefined4 in_register_00000034;
  Disposer *in_R8;
  Own<kj::_::ImmediatePromiseNode<kj::_::Void>_> OVar6;
  Own<kj::_::ChainPromiseNode> OVar7;
  Promise<void> PVar8;
  Own<kj::_::PromiseNode> local_88;
  Own<kj::_::PromiseNode> local_78;
  undefined1 local_68 [24];
  pointer_____offset_0x10___ *local_50;
  long *local_48;
  Disposer *local_40;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  if ((uint)cap < 0x65) {
    local_68._8_4_ = (uint)cap;
    local_68._0_8_ = (_func_int **)CONCAT44(in_register_00000034,depth);
    (**(code **)(**(long **)((context.hook)->_vptr_CallContextHook[-3] +
                            (long)&context.hook[1]._vptr_CallContextHook) + 0x20))(&local_50);
    local_68._16_8_ = &Capability::Client::typeinfo;
    local_40 = in_R8;
    kj::_::yield();
    this_00 = (TransformPromiseNodeBase *)operator_new(0x58);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_88,
               kj::_::
               TransformPromiseNode<kj::Promise<void>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++:1118:26),_kj::_::PropagateException>
               ::anon_class_48_4_ba8e04f4_for_func::operator());
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00612288;
    this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)local_68._0_8_;
    *(undefined4 *)&this_00[1].dependency.disposer = local_68._8_4_;
    puVar1 = *(pointer_____offset_0x10___ *)(local_68._16_8_ + -0x18);
    pp_Var2 = *(_func_int ***)(puVar1 + (long)&local_50);
    this_00[1].continuationTracePtr = *(void **)(puVar1 + (long)(local_68 + 0x10));
    this_00[2].super_PromiseNode._vptr_PromiseNode = pp_Var2;
    *(undefined8 *)(puVar1 + (long)&local_50) = 0;
    this_00[1].dependency.ptr = (PromiseNode *)&Capability::Client::typeinfo;
    this_00[2].dependency.disposer = local_40;
    local_78.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,capnp::_::TestMoreStuffImpl::loop(unsigned_int,capnproto_test::capnp::test::TestInterface::Client,capnp::CallContext<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>)::$_0,kj::_::PropagateException>>
          ::instance;
    local_78.ptr = (PromiseNode *)this_00;
    OVar7 = kj::heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_38,&local_78)
    ;
    pPVar3 = local_78.ptr;
    pIVar5 = (ImmediatePromiseNode<kj::_::Void> *)OVar7.ptr;
    *(undefined4 *)&this->super_Server = local_38;
    *(undefined4 *)&(this->super_Server).field_0x4 = uStack_34;
    *(undefined4 *)&(this->super_Server).field_0x8 = uStack_30;
    *(undefined4 *)&(this->super_Server).field_0xc = uStack_2c;
    if ((TransformPromiseNodeBase *)local_78.ptr != (TransformPromiseNodeBase *)0x0) {
      local_78.ptr = (PromiseNode *)0x0;
      (**(local_78.disposer)->_vptr_Disposer)
                (local_78.disposer,
                 ((PromiseNode *)&pPVar3->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pPVar3->_vptr_PromiseNode)->_vptr_PromiseNode);
      pIVar5 = extraout_RDX;
    }
    pPVar3 = local_88.ptr;
    if (local_88.ptr != (PromiseNode *)0x0) {
      local_88.ptr = (PromiseNode *)0x0;
      (**(local_88.disposer)->_vptr_Disposer)
                (local_88.disposer,pPVar3->_vptr_PromiseNode[-2] + (long)&pPVar3->_vptr_PromiseNode)
      ;
      pIVar5 = extraout_RDX_00;
    }
    plVar4 = local_48;
    if (local_48 != (long *)0x0) {
      local_48 = (long *)0x0;
      (**(code **)*local_50)(local_50,(long)plVar4 + *(long *)(*plVar4 + -0x10));
      pIVar5 = extraout_RDX_01;
    }
  }
  else {
    local_68._8_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
    ;
    local_68._16_4_ = 0x45b;
    local_68[0] = true;
    kj::_::Debug::log<char_const(&)[19],char_const(&)[28]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x45b,ERROR,"\"expectation failed\", info",(char (*) [19])"expectation failed",
               (char (*) [28])"Looped too long, giving up.");
    kj::AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)local_68);
    OVar6 = kj::heap<kj::_::ImmediatePromiseNode<kj::_::Void>,kj::_::Void>((Void *)local_68);
    pIVar5 = OVar6.ptr;
    *(undefined8 *)&this->super_Server = local_68._0_8_;
    *(undefined8 *)&(this->super_Server).field_0x8 = local_68._8_8_;
  }
  PVar8.super_PromiseBase.node.ptr = (PromiseNode *)pIVar5;
  PVar8.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar8.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::loop(uint depth, test::TestInterface::Client cap,
                                          ExpectCancelContext context) {
  if (depth > 100) {
    ADD_FAILURE() << "Looped too long, giving up.";
    return kj::READY_NOW;
  } else {
    return kj::evalLater([this,depth,KJ_CPCAP(cap),KJ_CPCAP(context)]() mutable {
      return loop(depth + 1, cap, context);
    });
  }